

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_unpack_connack_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  mqtt_response_connack *response;
  uint8_t *start;
  uint8_t *buf_local;
  mqtt_response *mqtt_response_local;
  
  if ((mqtt_response->fixed_header).remaining_length == 2) {
    if ((*buf & 0xfe) == 0) {
      (mqtt_response->decoded).connack.session_present_flag = *buf;
      if (buf[1] < 6) {
        mqtt_response_local = (mqtt_response *)0x2;
        *(uint *)((long)&mqtt_response->decoded + 4) = (uint)buf[1];
      }
      else {
        mqtt_response_local = (mqtt_response *)0xffffffff80000009;
      }
    }
    else {
      mqtt_response_local = (mqtt_response *)0xffffffff80000008;
    }
  }
  else {
    mqtt_response_local = (mqtt_response *)0xffffffff8000000c;
  }
  return (ssize_t)mqtt_response_local;
}

Assistant:

ssize_t mqtt_unpack_connack_response(struct mqtt_response *mqtt_response, const uint8_t *buf) {
    const uint8_t *const start = buf;
    struct mqtt_response_connack *response;

    /* check that remaining length is 2 */
    if (mqtt_response->fixed_header.remaining_length != 2) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }
    
    response = &(mqtt_response->decoded.connack);
    /* unpack */
    if (*buf & 0xFE) {
        /* only bit 1 can be set */
        return MQTT_ERROR_CONNACK_FORBIDDEN_FLAGS;
    } else {
        response->session_present_flag = *buf++;
    }

    if (*buf > 5u) {
        /* only bit 1 can be set */
        return MQTT_ERROR_CONNACK_FORBIDDEN_CODE;
    } else {
        response->return_code = (enum MQTTConnackReturnCode) *buf++;
    }
    return buf - start;
}